

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationRuleParser::skipComment(CollationRuleParser *this,int32_t i)

{
  int iVar1;
  short sVar2;
  UnicodeString *this_00;
  char16_t cVar3;
  int32_t iVar4;
  
  do {
    this_00 = this->rules;
    sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar4 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar2 >> 5;
    }
    if (iVar4 <= i) {
      return i;
    }
    iVar1 = i + 1;
    cVar3 = UnicodeString::doCharAt(this_00,i);
    if (((ushort)cVar3 < 0xe) && ((0x3400U >> ((ushort)cVar3 & 0x1f) & 1) != 0)) {
      return iVar1;
    }
    if ((ushort)cVar3 - 0x2028 < 2) {
      return iVar1;
    }
    i = iVar1;
  } while ((ushort)cVar3 != 0x85);
  return iVar1;
}

Assistant:

int32_t
CollationRuleParser::skipComment(int32_t i) const {
    // skip to past the newline
    while(i < rules->length()) {
        UChar c = rules->charAt(i++);
        // LF or FF or CR or NEL or LS or PS
        if(c == 0xa || c == 0xc || c == 0xd || c == 0x85 || c == 0x2028 || c == 0x2029) {
            // Unicode Newline Guidelines: "A readline function should stop at NLF, LS, FF, or PS."
            // NLF (new line function) = CR or LF or CR+LF or NEL.
            // No need to collect all of CR+LF because a following LF will be ignored anyway.
            break;
        }
    }
    return i;
}